

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::X86Compiler::_emit
          (X86Compiler *this,uint32_t instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *o3,
          Operand_ *o4,Operand_ *o5)

{
  CBNode **ppCVar1;
  ZoneHeap *this_00;
  uint32_t uVar2;
  Zone *pZVar3;
  anon_union_8_2_78723da6_for_MemData_2 aVar4;
  ushort uVar5;
  uint uVar6;
  Error EVar7;
  int iVar8;
  CBNode *node;
  void **ppvVar9;
  undefined4 extraout_var;
  char *pcVar10;
  uint8_t uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  CBNode **ppCVar15;
  uint uVar16;
  Detail instDetail;
  StringBuilderTmp<256UL> sb;
  Operand opArray [6];
  Detail local_1d0;
  StringBuilder local_1c0;
  CBLabel local_1a0 [4];
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  UInt64 local_88;
  anon_union_8_2_78723da6_for_MemData_2 aStack_80;
  UInt64 local_78;
  anon_union_8_2_78723da6_for_MemData_2 aStack_70;
  UInt64 local_68;
  anon_union_8_2_78723da6_for_MemData_2 aStack_60;
  UInt64 local_58;
  anon_union_8_2_78723da6_for_MemData_2 aStack_50;
  UInt64 local_48;
  anon_union_8_2_78723da6_for_MemData_2 aStack_40;
  
  pcVar10 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment;
  uVar16 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._globalOptions |
           (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options;
  uVar6 = 5;
  if ((undefined1  [16])((undefined1  [16])o4->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    uVar6 = ((((uint)((undefined1  [16])((undefined1  [16])o1->field_0 & (undefined1  [16])0x7) !=
                     (undefined1  [16])0x0) -
              (uint)((undefined1  [16])((undefined1  [16])o0->field_0 & (undefined1  [16])0x7) ==
                    (undefined1  [16])0x0)) -
             (uint)((undefined1  [16])((undefined1  [16])o2->field_0 & (undefined1  [16])0x7) ==
                   (undefined1  [16])0x0)) + 3) -
            (uint)((undefined1  [16])((undefined1  [16])o3->field_0 & (undefined1  [16])0x7) ==
                  (undefined1  [16])0x0);
  }
  uVar12 = 6;
  if ((undefined1  [16])((undefined1  [16])o5->field_0 & (undefined1  [16])0x7) ==
      (undefined1  [16])0x0) {
    uVar12 = (ulong)uVar6;
  }
  uVar6 = (uint)uVar12;
  if ((uVar16 & 3) == 0) goto LAB_0016ebe1;
  EVar7 = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._lastError;
  if (EVar7 != 0) {
    return EVar7;
  }
  if ((uVar16 & 2) == 0) goto LAB_0016ebe1;
  local_98._packed[0].field_10 = (o0->field_0)._packed[0];
  local_98._mem.field_2 = (o0->field_0)._mem.field_2;
  local_88 = (o1->field_0)._packed[0];
  aStack_80 = (o1->field_0)._mem.field_2;
  local_78 = (o2->field_0)._packed[0];
  aStack_70 = (o2->field_0)._mem.field_2;
  local_68 = (o3->field_0)._packed[0];
  aStack_60 = (o3->field_0)._mem.field_2;
  local_58 = (o4->field_0)._packed[0];
  aStack_50 = (o4->field_0)._mem.field_2;
  local_48 = (o5->field_0)._packed[0];
  aStack_40 = (o5->field_0)._mem.field_2;
  local_1d0.extraReg = (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg;
  local_1d0.instId = instId;
  local_1d0.options = uVar16;
  EVar7 = Inst::validate((uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter.
                               _codeInfo._archInfo.field_0.field_0._type,&local_1d0,
                         (Operand_ *)&local_98._any,uVar6);
  if (EVar7 != 0) {
    local_1c0._data = (char *)local_1a0;
    local_1a0[0].super_CBNode._prev._0_1_ = 0;
    local_1c0._length = 0;
    local_1c0._capacity = 0x100;
    local_1c0._canFree = 0;
    pcVar10 = DebugUtils::errorAsString(EVar7);
    StringBuilder::_opString(&local_1c0,1,pcVar10,0xffffffffffffffff);
    StringBuilder::_opString(&local_1c0,1,": ",0xffffffffffffffff);
    Logging::formatInstruction
              (&local_1c0,0,(CodeEmitter *)this,
               (uint)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._codeInfo.
                     _archInfo.field_0.field_0._type,&local_1d0,(Operand_ *)&local_98._any,uVar6);
    EVar7 = CodeEmitter::setLastError((CodeEmitter *)this,EVar7,local_1c0._data);
    StringBuilder::~StringBuilder(&local_1c0);
    return EVar7;
  }
  do {
    uVar16 = uVar16 & 0xfffffffd;
LAB_0016ebe1:
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._options = 0;
    (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._inlineComment = (char *)0x0;
    this_00 = &(this->super_CodeCompiler).super_CodeBuilder._cbHeap;
    pZVar3 = (this->super_CodeCompiler).super_CodeBuilder._cbHeap._zone;
    if (instId - 0x113 < 0x20 || instId - 0x176 < 3) {
      if (pZVar3 != (Zone *)0x0) {
        node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(uVar6 * 0x10 + 0x58),(size_t *)&local_1c0)
        ;
        if (node == (CBNode *)0x0) goto LAB_0016f0cf;
        ppCVar1 = &node[2]._next;
        if (uVar6 != 0) {
          aVar4 = (o0->field_0)._mem.field_2;
          *ppCVar1 = (CBNode *)(o0->field_0)._packed[0];
          *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar4;
          if (uVar6 != 1) {
            aVar4 = (o1->field_0)._mem.field_2;
            node[2]._inlineComment = (char *)(o1->field_0)._packed[0];
            node[2]._passData = (void *)aVar4;
            if (2 < uVar6) {
              aVar4 = (o2->field_0)._mem.field_2;
              node[3]._prev = (CBNode *)(o2->field_0)._packed[0];
              node[3]._next = (CBNode *)aVar4;
              if (uVar6 != 3) {
                aVar4 = (o3->field_0)._mem.field_2;
                *(UInt64 *)&node[3]._type = (o3->field_0)._packed[0];
                node[3]._inlineComment = (char *)aVar4;
                if (4 < uVar6) {
                  aVar4 = (o4->field_0)._mem.field_2;
                  node[3]._passData = (void *)(o4->field_0)._packed[0];
                  node[4]._prev = (CBNode *)aVar4;
                  if (uVar6 != 5) {
                    aVar4 = (o5->field_0)._mem.field_2;
                    node[4]._next = (CBNode *)(o5->field_0)._packed[0];
                    *(anon_union_8_2_78723da6_for_MemData_2 *)&node[4]._type = aVar4;
                  }
                }
              }
            }
          }
        }
        node->_prev = (CBNode *)0x0;
        node->_next = (CBNode *)0x0;
        node->_type = '\x01';
        uVar2 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
        node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
        uVar5 = (ushort)uVar2 | 4;
        uVar11 = 0xff;
        node->_inlineComment = (char *)0x0;
        node->_passData = (void *)0x0;
        node[1]._prev = (CBNode *)0x0;
        node[1]._next = (CBNode *)0x0;
        node->_flags = uVar5;
        *(uint32_t *)&node[1]._prev = instId;
        *(uint *)((long)&node[1]._prev + 4) = uVar16;
        node->_opCount = (uint8_t)uVar12;
        node[1]._inlineComment = (char *)ppCVar1;
        if (uVar6 == 0) goto LAB_0016ee6c;
        uVar14 = 0;
        ppCVar15 = ppCVar1;
        goto LAB_0016ed26;
      }
      _emit();
    }
    else if (pZVar3 != (Zone *)0x0) break;
    _emit();
  } while( true );
  node = (CBNode *)ZoneHeap::_alloc(this_00,(ulong)(uVar6 * 0x10 + 0x48),(size_t *)&local_1c0);
  if (node == (CBNode *)0x0) {
LAB_0016f0cf:
    EVar7 = 1;
LAB_0016eeba:
    EVar7 = CodeEmitter::setLastError((CodeEmitter *)this,EVar7,(char *)0x0);
    return EVar7;
  }
  ppvVar9 = &node[1]._passData;
  if (uVar6 != 0) {
    aVar4 = (o0->field_0)._mem.field_2;
    *ppvVar9 = (void *)(o0->field_0)._packed[0];
    node[2]._prev = (CBNode *)aVar4;
    if (uVar6 != 1) {
      aVar4 = (o1->field_0)._mem.field_2;
      node[2]._next = (CBNode *)(o1->field_0)._packed[0];
      *(anon_union_8_2_78723da6_for_MemData_2 *)&node[2]._type = aVar4;
      if (2 < uVar6) {
        aVar4 = (o2->field_0)._mem.field_2;
        node[2]._inlineComment = (char *)(o2->field_0)._packed[0];
        node[2]._passData = (void *)aVar4;
        if (uVar6 != 3) {
          aVar4 = (o3->field_0)._mem.field_2;
          node[3]._prev = (CBNode *)(o3->field_0)._packed[0];
          node[3]._next = (CBNode *)aVar4;
          if (4 < uVar6) {
            aVar4 = (o4->field_0)._mem.field_2;
            *(UInt64 *)&node[3]._type = (o4->field_0)._packed[0];
            node[3]._inlineComment = (char *)aVar4;
            if (uVar6 != 5) {
              aVar4 = (o5->field_0)._mem.field_2;
              node[3]._passData = (void *)(o5->field_0)._packed[0];
              node[4]._prev = (CBNode *)aVar4;
            }
          }
        }
      }
    }
  }
  node->_prev = (CBNode *)0x0;
  node->_next = (CBNode *)0x0;
  node->_type = '\x01';
  uVar2 = (this->super_CodeCompiler).super_CodeBuilder._nodeFlags;
  node->_position = (this->super_CodeCompiler).super_CodeBuilder._position;
  *(undefined1 (*) [32])&node->_inlineComment = ZEXT432(0) << 0x40;
  node->_flags = (ushort)uVar2 | 4;
  *(uint32_t *)&node[1]._prev = instId & 0xffff;
  uVar11 = 0xff;
  *(uint *)((long)&node[1]._prev + 4) = uVar16;
  node->_opCount = (uint8_t)uVar12;
  node[1]._inlineComment = (char *)ppvVar9;
  if (uVar6 != 0) {
    uVar14 = 0;
    do {
      if (((ulong)*ppvVar9 & 7) == 2) {
        uVar11 = (uint8_t)uVar14;
        break;
      }
      uVar14 = uVar14 + 1;
      ppvVar9 = ppvVar9 + 2;
    } while (uVar12 != uVar14);
  }
  node[1]._type = uVar11;
  node[1]._next = (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg
  ;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  goto LAB_0016ef5a;
  while( true ) {
    uVar14 = uVar14 + 1;
    ppCVar15 = ppCVar15 + 2;
    if (uVar12 == uVar14) break;
LAB_0016ed26:
    if (((ulong)*ppCVar15 & 7) == 2) {
      uVar11 = (uint8_t)uVar14;
      break;
    }
  }
LAB_0016ee6c:
  node[1]._type = uVar11;
  node[1]._passData = (void *)0x0;
  node[2]._prev = (CBNode *)0x0;
  node[1]._next = (CBNode *)(this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg
  ;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._signature = 0;
  (this->super_CodeCompiler).super_CodeBuilder.super_CodeEmitter._extraReg._id = 0;
  local_1c0._data = (char *)0x0;
  if ((uVar16 & 0x10) == 0) {
    if (((ulong)*ppCVar1 & 7) == 4) {
      EVar7 = CodeBuilder::getCBLabel
                        ((CodeBuilder *)this,(CBLabel **)&local_1c0,
                         *(uint32_t *)((long)&node[2]._next + 4));
      if (EVar7 != 0) goto LAB_0016eeba;
      uVar5 = node->_flags;
    }
    else {
      uVar16 = uVar16 | 0x10;
    }
  }
  *(uint *)((long)&node[1]._prev + 4) = uVar16;
  uVar13 = 0x50;
  if (instId != 0x11e) {
    uVar13 = 0x20;
  }
  node->_flags = uVar5 | uVar13;
  node[1]._passData = local_1c0._data;
  node[2]._prev = (CBNode *)0x0;
  if (local_1c0._data != (char *)0x0) {
    node[2]._prev = *(CBNode **)(local_1c0._data + 0x30);
    *(CBNode **)(local_1c0._data + 0x30) = node;
    *(int *)(local_1c0._data + 0x2c) = *(int *)(local_1c0._data + 0x2c) + 1;
  }
  if ((instId == 0x11e) || ((uVar16 & 0x100) != 0)) {
    node->_flags = uVar5 | uVar13 | 0x40;
  }
LAB_0016ef5a:
  if (pcVar10 != (char *)0x0) {
    strlen(pcVar10);
    iVar8 = Zone::dup(&(this->super_CodeCompiler).super_CodeBuilder._cbDataZone,(int)pcVar10);
    node->_inlineComment = (char *)CONCAT44(extraout_var,iVar8);
  }
  CodeBuilder::addNode((CodeBuilder *)this,node);
  return 0;
}

Assistant:

Error X86Compiler::_emit(uint32_t instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3, const Operand_& o4, const Operand_& o5) {
  uint32_t options = getOptions() | getGlobalOptions();
  const char* inlineComment = getInlineComment();

  uint32_t opCount = static_cast<uint32_t>(!o0.isNone()) +
                     static_cast<uint32_t>(!o1.isNone()) +
                     static_cast<uint32_t>(!o2.isNone()) +
                     static_cast<uint32_t>(!o3.isNone()) ;

  // Count 5th and 6th operands.
  if (!o4.isNone()) opCount = 5;
  if (!o5.isNone()) opCount = 6;

  // Handle failure and rare cases first.
  const uint32_t kErrorsAndSpecialCases = kOptionMaybeFailureCase | // CodeEmitter in error state.
                                          kOptionStrictValidation ; // Strict validation.

  if (ASMJIT_UNLIKELY(options & kErrorsAndSpecialCases)) {
    // Don't do anything if we are in error state.
    if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_VALIDATION)
    // Strict validation.
    if (options & kOptionStrictValidation) {
      Operand opArray[] = {
        Operand(o0),
        Operand(o1),
        Operand(o2),
        Operand(o3),
        Operand(o4),
        Operand(o5)
      };

      Inst::Detail instDetail(instId, options, _extraReg);
      Error err = Inst::validate(getArchType(), instDetail, opArray, opCount);

      if (err) {
#if !defined(ASMJIT_DISABLE_LOGGING)
        StringBuilderTmp<256> sb;
        sb.appendString(DebugUtils::errorAsString(err));
        sb.appendString(": ");
        Logging::formatInstruction(sb, 0, this, getArchType(), instDetail, opArray, opCount);
        return setLastError(err, sb.getData());
#else
        return setLastError(err);
#endif
      }

      // Clear it as it must be enabled explicitly on assembler side.
      options &= ~kOptionStrictValidation;
    }
#endif // ASMJIT_DISABLE_VALIDATION
  }

  resetOptions();
  resetInlineComment();

  // decide between `CBInst` and `CBJump`.
  if (isJumpInst(instId)) {
    CBJump* node = _cbHeap.allocT<CBJump>(sizeof(CBJump) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBJump));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    new(node) CBJump(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    CBLabel* jTarget = nullptr;
    if (!(options & kOptionUnfollow)) {
      if (opArray[0].isLabel()) {
        Error err = getCBLabel(&jTarget, static_cast<Label&>(opArray[0]));
        if (err) return setLastError(err);
      }
      else {
        options |= kOptionUnfollow;
      }
    }
    node->setOptions(options);

    node->orFlags(instId == X86Inst::kIdJmp ? CBNode::kFlagIsJmp | CBNode::kFlagIsTaken : CBNode::kFlagIsJcc);
    node->_target = jTarget;
    node->_jumpNext = nullptr;

    if (jTarget) {
      node->_jumpNext = static_cast<CBJump*>(jTarget->_from);
      jTarget->_from = node;
      jTarget->addNumRefs();
    }

    // The 'jmp' is always taken, conditional jump can contain hint, we detect it.
    if (instId == X86Inst::kIdJmp)
      node->orFlags(CBNode::kFlagIsTaken);
    else if (options & X86Inst::kOptionTaken)
      node->orFlags(CBNode::kFlagIsTaken);

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
  else {
    CBInst* node = _cbHeap.allocT<CBInst>(sizeof(CBInst) + opCount * sizeof(Operand));
    Operand* opArray = reinterpret_cast<Operand*>(reinterpret_cast<uint8_t*>(node) + sizeof(CBInst));

    if (ASMJIT_UNLIKELY(!node))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

    if (opCount > 0) opArray[0].copyFrom(o0);
    if (opCount > 1) opArray[1].copyFrom(o1);
    if (opCount > 2) opArray[2].copyFrom(o2);
    if (opCount > 3) opArray[3].copyFrom(o3);
    if (opCount > 4) opArray[4].copyFrom(o4);
    if (opCount > 5) opArray[5].copyFrom(o5);

    node = new(node) CBInst(this, instId, options, opArray, opCount);
    node->_instDetail.extraReg = _extraReg;
    _extraReg.reset();

    if (inlineComment) {
      inlineComment = static_cast<char*>(_cbDataZone.dup(inlineComment, ::strlen(inlineComment), true));
      node->setInlineComment(inlineComment);
    }

    addNode(node);
    return kErrorOk;
  }
}